

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

FILE * fopen_comp(char *file,char *mode,int32 *ispipe)

{
  int iVar1;
  char *local_48;
  char *command_1;
  char *command;
  FILE *pFStack_30;
  int32 isgz;
  FILE *fp;
  int32 *ispipe_local;
  char *mode_local;
  char *file_local;
  
  fp = (FILE *)ispipe;
  ispipe_local = (int32 *)mode;
  mode_local = file;
  guess_comptype(file,ispipe,(int32 *)((long)&command + 4));
  if (fp->_flags == 0) {
    pFStack_30 = fopen(mode_local,(char *)ispipe_local);
  }
  else {
    iVar1 = strcmp((char *)ispipe_local,"r");
    if (iVar1 == 0) {
      if (command._4_4_ == 1) {
        command_1 = string_join("zcat"," ",mode_local,0);
      }
      else if (command._4_4_ == 2) {
        command_1 = string_join("gunzip"," -c ",mode_local,0);
      }
      else {
        if (command._4_4_ != 3) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                  ,0x89,"Unknown  compression type %d\n",(ulong)command._4_4_);
          exit(1);
        }
        command_1 = string_join("bunzip2"," -c ",mode_local,0);
      }
      pFStack_30 = popen(command_1,(char *)ispipe_local);
      if (pFStack_30 == (FILE *)0x0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                       ,0x8c,"Failed to open a pipe for a command \'%s\' mode \'%s\'",command_1,
                       ispipe_local);
        ckd_free(command_1);
        return (FILE *)0x0;
      }
      ckd_free(command_1);
    }
    else {
      iVar1 = strcmp((char *)ispipe_local,"w");
      if (iVar1 != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                ,0xaa,"Compressed file operation for mode %s is not supported\n",ispipe_local);
        return (FILE *)0x0;
      }
      if (command._4_4_ == 1) {
        local_48 = string_join("compress"," -c > ",mode_local,0);
      }
      else if (command._4_4_ == 2) {
        local_48 = string_join("gzip"," > ",mode_local,0);
      }
      else {
        if (command._4_4_ != 3) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                  ,0xa0,"Unknown compression type %d\n",(ulong)command._4_4_);
          exit(1);
        }
        local_48 = string_join("bzip2"," > ",mode_local,0);
      }
      pFStack_30 = popen(local_48,(char *)ispipe_local);
      if (pFStack_30 == (FILE *)0x0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                       ,0xa3,"Failed to open a pipe for a command \'%s\' mode \'%s\'",local_48,
                       ispipe_local);
        ckd_free(local_48);
        return (FILE *)0x0;
      }
      ckd_free(local_48);
    }
  }
  return (FILE *)pFStack_30;
}

Assistant:

FILE *
fopen_comp(const char *file, const char *mode, int32 * ispipe)
{
    FILE *fp;

#ifndef HAVE_POPEN
    *ispipe = 0; /* No popen() on WinCE */
#else /* HAVE_POPEN */
    int32 isgz;
    guess_comptype(file, ispipe, &isgz);
#endif /* HAVE_POPEN */

    if (*ispipe) {
#ifndef HAVE_POPEN
        /* Shouldn't get here, anyway */
        E_FATAL("No popen() on WinCE\n");
#else
        if (strcmp(mode, "r") == 0) {
            char *command;
            switch (isgz) {
            case COMP_GZIP:
                command = string_join("gunzip" EXEEXT, " -c ", file, NULL);
                break;
            case COMP_COMPRESS:
                command = string_join("zcat" EXEEXT, " ", file, NULL);
                break;
            case COMP_BZIP2:
                command = string_join("bunzip2" EXEEXT, " -c ", file, NULL);
                break;
            default:
                command = NULL; /* Make compiler happy. */
                E_FATAL("Unknown  compression type %d\n", isgz);
            }
            if ((fp = popen(command, mode)) == NULL) {
                E_ERROR_SYSTEM("Failed to open a pipe for a command '%s' mode '%s'", command, mode);
                ckd_free(command);
                return NULL;
            }
            ckd_free(command);
        }
        else if (strcmp(mode, "w") == 0) {
            char *command;
            switch (isgz) {
            case COMP_GZIP:
                command = string_join("gzip" EXEEXT, " > ", file, NULL);
                break;
            case COMP_COMPRESS:
                command = string_join("compress" EXEEXT, " -c > ", file, NULL);
                break;
            case COMP_BZIP2:
                command = string_join("bzip2" EXEEXT, " > ", file, NULL);
                break;
            default:
                command = NULL; /* Make compiler happy. */
                E_FATAL("Unknown compression type %d\n", isgz);
            }
            if ((fp = popen(command, mode)) == NULL) {
                E_ERROR_SYSTEM("Failed to open a pipe for a command '%s' mode '%s'", command, mode);
                ckd_free(command);
                return NULL;
            }
            ckd_free(command);
        }
        else {
            E_ERROR("Compressed file operation for mode %s is not supported\n", mode);
            return NULL;
        }
#endif /* HAVE_POPEN */
    }
    else {
        fp = fopen(file, mode);
    }

    return (fp);
}